

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Train(string *filename)

{
  allocator<int> *paVar1;
  int iVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  clock_t cVar9;
  char *__file;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  clock_t cVar13;
  clock_t end_time;
  int local_220;
  short b;
  short a;
  int i;
  short cnt_label1;
  short cnt_label0;
  reference_wrapper<short> local_210;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_208;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_200;
  int local_1f8 [2];
  thread local_1f0;
  thread t3;
  short local_1e0;
  allocator<int> local_1dd;
  value_type_conflict1 vStack_1dc;
  short cnt_label1_part3;
  short cnt_label0_part3;
  vector<int,_std::allocator<int>_> sum_label1_part3;
  undefined1 local_1b8 [8];
  vector<int,_std::allocator<int>_> sum_label0_part3;
  reference_wrapper<short> local_198;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_190;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_188;
  int local_180 [2];
  thread local_178;
  thread t2;
  short local_168;
  allocator<int> local_165;
  value_type_conflict1 vStack_164;
  short cnt_label1_part2;
  short cnt_label0_part2;
  vector<int,_std::allocator<int>_> sum_label1_part2;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> sum_label0_part2;
  reference_wrapper<short> local_120;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_118;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_110;
  int local_108 [2];
  thread local_100;
  thread t1;
  short local_f0;
  allocator<int> local_ed;
  value_type_conflict1 vStack_ec;
  short cnt_label1_part1;
  short cnt_label0_part1;
  vector<int,_std::allocator<int>_> sum_label1_part1;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> sum_label0_part1;
  reference_wrapper<short> local_a8;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_a0;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_98;
  int local_90 [2];
  thread local_88;
  thread t0;
  short local_78;
  allocator<int> local_75;
  value_type_conflict1 vStack_74;
  short cnt_label1_part0;
  short cnt_label0_part0;
  vector<int,_std::allocator<int>_> sum_label1_part0;
  allocator<int> local_45;
  value_type_conflict1 local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> sum_label0_part0;
  char *buf;
  int buf_len;
  int fd;
  clock_t start_time;
  string *filename_local;
  
  cVar9 = clock();
  __file = (char *)std::__cxx11::string::c_str();
  iVar8 = open(__file,0);
  sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)mmap((void *)0x0,0xbc2000,1,2,iVar8,0);
  close(iVar8);
  sVar10 = (size_type)features_num;
  local_44 = 0;
  std::allocator<int>::allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,sVar10,&local_44,&local_45);
  std::allocator<int>::~allocator(&local_45);
  sVar10 = (size_type)features_num;
  vStack_74 = 0;
  std::allocator<int>::allocator(&local_75);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part0,sVar10,&stack0xffffffffffffff8c,
             &local_75);
  std::allocator<int>::~allocator(&local_75);
  local_78 = 0;
  t0._M_id._M_thread._6_2_ = 0;
  local_90[1] = 0;
  local_90[0] = 400;
  local_98 = std::ref<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)local_40);
  local_a0 = std::ref<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)&cnt_label0_part0);
  local_a8 = std::ref<short>(&local_78);
  sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::ref<short>((short *)((long)&t0._M_id._M_thread + 6));
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&local_88,CalcTrainSum,
             (char **)&sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_90 + 1,local_90,&local_98,
             &local_a0,&local_a8,
             (reference_wrapper<short> *)
             &sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar10 = (size_type)features_num;
  sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,sVar10,
             (value_type_conflict1 *)
             ((long)&sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  sVar10 = (size_type)features_num;
  vStack_ec = 0;
  std::allocator<int>::allocator(&local_ed);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part1,sVar10,&stack0xffffffffffffff14,
             &local_ed);
  std::allocator<int>::~allocator(&local_ed);
  local_f0 = 0;
  t1._M_id._M_thread._6_2_ = 0;
  local_108[1] = 400;
  local_108[0] = 400;
  local_110 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_c8);
  local_118 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part1);
  local_120 = std::ref<short>(&local_f0);
  sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::ref<short>((short *)((long)&t1._M_id._M_thread + 6));
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&local_100,CalcTrainSum,
             (char **)&sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_108 + 1,local_108,&local_110,
             &local_118,&local_120,
             (reference_wrapper<short> *)
             &sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar10 = (size_type)features_num;
  sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,sVar10,
             (value_type_conflict1 *)
             ((long)&sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  sVar10 = (size_type)features_num;
  vStack_164 = 0;
  std::allocator<int>::allocator(&local_165);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part2,sVar10,&stack0xfffffffffffffe9c,
             &local_165);
  std::allocator<int>::~allocator(&local_165);
  local_168 = 0;
  t2._M_id._M_thread._6_2_ = 0;
  local_180[1] = 800;
  local_180[0] = 400;
  local_188 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_140);
  local_190 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part2);
  local_198 = std::ref<short>(&local_168);
  sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::ref<short>((short *)((long)&t2._M_id._M_thread + 6));
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&local_178,CalcTrainSum,
             (char **)&sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_180 + 1,local_180,&local_188,
             &local_190,&local_198,
             (reference_wrapper<short> *)
             &sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar10 = (size_type)features_num;
  sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1b8,sVar10,
             (value_type_conflict1 *)
             ((long)&sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  sVar10 = (size_type)features_num;
  vStack_1dc = 0;
  std::allocator<int>::allocator(&local_1dd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part3,sVar10,&stack0xfffffffffffffe24,
             &local_1dd);
  std::allocator<int>::~allocator(&local_1dd);
  local_1e0 = 0;
  t3._M_id._M_thread._6_2_ = 0;
  local_1f8[1] = 0x4b0;
  local_1f8[0] = 400;
  local_200 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_1b8);
  local_208 = std::ref<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part3);
  local_210 = std::ref<short>(&local_1e0);
  _i = std::ref<short>((short *)((long)&t3._M_id._M_thread + 6));
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&local_1f0,CalcTrainSum,
             (char **)&sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_1f8 + 1,local_1f8,&local_200,
             &local_208,&local_210,(reference_wrapper<short> *)&i);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  sVar6 = local_78 + local_f0 + local_168 + local_1e0;
  sVar7 = t0._M_id._M_thread._6_2_ + t1._M_id._M_thread._6_2_ + t2._M_id._M_thread._6_2_ +
          t3._M_id._M_thread._6_2_;
  for (local_220 = 0; local_220 < features_num; local_220 = local_220 + 1) {
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_40,(long)local_220);
    iVar8 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_c8,(long)local_220);
    iVar2 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_140,(long)local_220);
    iVar3 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1b8,(long)local_220);
    sVar4 = (short)((iVar8 + iVar2 + iVar3 + *pvVar11) / (int)sVar6);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part0,(long)local_220);
    iVar8 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part1,(long)local_220);
    iVar2 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part2,(long)local_220);
    iVar3 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&cnt_label0_part3,(long)local_220);
    sVar5 = (short)((iVar8 + iVar2 + iVar3 + *pvVar11) / (int)sVar7);
    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[](&means_add,(long)local_220);
    *pvVar12 = sVar4 + sVar5;
    pvVar12 = std::vector<short,_std::allocator<short>_>::operator[](&means_sub,(long)local_220);
    *pvVar12 = sVar5 - sVar4;
    C = (sVar4 - sVar5) * (sVar4 + sVar5);
  }
  C = (short)(uint)((ulong)((long)C * 0x51eb851f) >> 0x26) - (short)((long)C * 0x51eb851f >> 0x3f);
  cVar13 = clock();
  printf(anon_var_dwarf_8800,(double)(cVar13 - cVar9) / 1000000.0);
  std::thread::~thread(&local_1f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part3);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1b8);
  std::thread::~thread(&local_178);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part2);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_140);
  std::thread::~thread(&local_100);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
  std::thread::~thread(&local_88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&cnt_label0_part0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void Train (const string & filename) {

#ifdef TEST
    clock_t start_time = clock();
#endif

    int fd = open(filename.c_str(), O_RDONLY);

    int buf_len = 10 * 1024 * 1204;
    char * buf = (char *) mmap(NULL, buf_len, PROT_READ, MAP_PRIVATE, fd, 0);

    close(fd);

    vector<int> sum_label0_part0(features_num, 0);
    vector<int> sum_label1_part0(features_num, 0);
    short cnt_label0_part0 = 0;
    short cnt_label1_part0 = 0;
    thread t0(CalcTrainSum, buf, 0, 400, ref(sum_label0_part0), ref(sum_label1_part0), ref(cnt_label0_part0), ref(cnt_label1_part0));

    vector<int> sum_label0_part1(features_num, 0);
    vector<int> sum_label1_part1(features_num, 0);
    short cnt_label0_part1 = 0;
    short cnt_label1_part1 = 0;
    thread t1(CalcTrainSum, buf, 400, 400, ref(sum_label0_part1), ref(sum_label1_part1), ref(cnt_label0_part1), ref(cnt_label1_part1));

    vector<int> sum_label0_part2(features_num, 0);
    vector<int> sum_label1_part2(features_num, 0);
    short cnt_label0_part2 = 0;
    short cnt_label1_part2 = 0;
    thread t2(CalcTrainSum, buf, 800, 400, ref(sum_label0_part2), ref(sum_label1_part2), ref(cnt_label0_part2), ref(cnt_label1_part2));

    vector<int> sum_label0_part3(features_num, 0);
    vector<int> sum_label1_part3(features_num, 0);
    short cnt_label0_part3 = 0;
    short cnt_label1_part3 = 0;
    thread t3(CalcTrainSum, buf, 1200, 400, ref(sum_label0_part3), ref(sum_label1_part3), ref(cnt_label0_part3), ref(cnt_label1_part3));

    t0.join();
    t1.join();
    t2.join();
    t3.join();

    short cnt_label0 = cnt_label0_part0 + cnt_label0_part1 + cnt_label0_part2 + cnt_label0_part3;
    short cnt_label1 = cnt_label1_part0 + cnt_label1_part1 + cnt_label1_part2 + cnt_label1_part3;
    for (int i = 0; i < features_num; i++) {
        short a =  (sum_label0_part0[i] + sum_label0_part1[i] + sum_label0_part2[i] + sum_label0_part3[i]) / cnt_label0;
        short b = (sum_label1_part0[i] + sum_label1_part1[i] + sum_label1_part2[i] + sum_label1_part3[i]) / cnt_label1;
        means_add[i] = a + b;
        means_sub[i] = b - a;
        C = (a - b) * (a + b);
    }

    C = C / 200;

#ifdef TEST
    clock_t end_time = clock();
    printf("测试集读取耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

}